

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakefileDepsParser.cpp
# Opt level: O3

void lexWord(char **cur,char *end,SmallVectorImpl<char> *unescapedWord)

{
  byte bVar1;
  byte *pbVar2;
  ulong uVar3;
  char *Elt;
  undefined8 uStack_38;
  
  pbVar2 = (byte *)*cur;
  if (pbVar2 != (byte *)end) {
    uStack_38 = pbVar2;
    do {
      bVar1 = *pbVar2;
      uVar3 = (ulong)bVar1;
      if (uVar3 < 0x3b) {
        if (uVar3 != 0x24) {
          if ((0x400000100002601U >> (uVar3 & 0x3f) & 1) != 0) {
            return;
          }
          goto LAB_001d230f;
        }
        if (pbVar2 + 1 == (byte *)end) {
          return;
        }
        if (pbVar2[1] != 0x24) {
          return;
        }
        uStack_38._0_5_ = CONCAT14(0x24,(undefined4)uStack_38);
        llvm::SmallVectorTemplateBase<char,_true>::push_back
                  (&unescapedWord->super_SmallVectorTemplateBase<char,_true>,
                   (char *)((long)&uStack_38 + 4));
        *cur = *cur + 1;
      }
      else {
LAB_001d230f:
        if (bVar1 == 0x5c) {
          pbVar2 = pbVar2 + 1;
          if ((pbVar2 != (byte *)end) && (*pbVar2 == 10)) {
            return;
          }
          *cur = (char *)pbVar2;
          bVar1 = *pbVar2;
          if ((bVar1 - 0x20 < 0x3d) &&
             ((0x1000000000000009U >> ((ulong)(bVar1 - 0x20) & 0x3f) & 1) != 0)) {
            uStack_38 = (byte *)CONCAT17(bVar1,(undefined7)uStack_38);
            Elt = (char *)((long)&uStack_38 + 7);
          }
          else {
            uStack_38._0_7_ = CONCAT16(0x5c,(undefined6)uStack_38);
            llvm::SmallVectorTemplateBase<char,_true>::push_back
                      (&unescapedWord->super_SmallVectorTemplateBase<char,_true>,
                       (char *)((long)&uStack_38 + 6));
            uStack_38._0_6_ = CONCAT15(bVar1,(undefined5)uStack_38);
            Elt = (char *)((long)&uStack_38 + 5);
          }
        }
        else {
          uStack_38._0_4_ = CONCAT13(bVar1,(undefined3)uStack_38);
          Elt = (char *)((long)&uStack_38 + 3);
        }
        llvm::SmallVectorTemplateBase<char,_true>::push_back
                  (&unescapedWord->super_SmallVectorTemplateBase<char,_true>,Elt);
      }
      pbVar2 = (byte *)(*cur + 1);
      *cur = (char *)pbVar2;
    } while (pbVar2 != (byte *)end);
  }
  return;
}

Assistant:

static void lexWord(const char*& cur, const char* end,
                    SmallVectorImpl<char> &unescapedWord) {
  for (; cur != end; ++cur) {
    int c = *cur;

    // Check if this is an escape sequence.
    if (c == '\\') {
      // If this is a line continuation, it ends the word.
      if (cur + 1 != end && cur[1] == '\n')
        break;

      // Otherwise, skip the escaped character.
      ++cur;
      int c = *cur;

      // Honor the escaping rules as generated by Clang and GCC, which are *not
      // necessarily* the actual escaping rules of BSD Make or GNU Make. Due to
      // incompatibilities in the escape syntax between those two makes, and the
      // GNU make behavior of retrying an escaped string with the original
      // input, GCC/Clang adopt a strategy around escaping ' ' and '#', but not
      // r"\\" itself, or any other characters. However, there are some
      // situations where Clang *will* generate an escaped '\\' using the
      // r"\\\\" sequence, so we also honor that.
      //
      // FIXME: Make this more complete, or move to a better dependency format.
      if (c == ' ' || c == '#' || c == '\\') {
        unescapedWord.push_back(c);
      } else {
        unescapedWord.push_back('\\');
        unescapedWord.push_back(c);
      }
      continue;
    } else if (c == '$' && cur + 1 != end && cur[1] == '$') {
      // "$$" is an escaped '$'.
      unescapedWord.push_back(c);
      ++cur;
      continue;
    }

    // Otherwise, if this is not a valid word character then skip it.
    if (!isWordChar(c)) {
#if defined(_WIN32)
      // If we encounter a colon and it looks like a driver letter separator, use
      // it as that instead of separating the word.
      if (c == ':' && cur + 1 != end && (*(cur + 1) == '/' || *(cur + 1) == '\\')) {
        unescapedWord.push_back(':');
        continue;
      }
#endif
      break;
    }
    unescapedWord.push_back(c);
  }
}